

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamIndexFactory_p.cpp
# Opt level: O2

BamIndex *
BamTools::Internal::BamIndexFactory::CreateIndexFromFilename
          (string *indexFilename,BamReaderPrivate *reader)

{
  __type _Var1;
  BamToolsIndex *this;
  string extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  FileExtension(&extension,indexFilename);
  if (extension._M_string_length != 0) {
    BamStandardIndex::Extension_abi_cxx11_();
    _Var1 = std::operator==(&extension,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (_Var1) {
      this = (BamToolsIndex *)operator_new(0x68);
      BamStandardIndex::BamStandardIndex((BamStandardIndex *)this,reader);
      goto LAB_0014c80f;
    }
    BamToolsIndex::Extension_abi_cxx11_();
    _Var1 = std::operator==(&extension,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (_Var1) {
      this = (BamToolsIndex *)operator_new(0x68);
      BamToolsIndex::BamToolsIndex(this,reader);
      goto LAB_0014c80f;
    }
  }
  this = (BamToolsIndex *)0x0;
LAB_0014c80f:
  std::__cxx11::string::~string((string *)&extension);
  return &this->super_BamIndex;
}

Assistant:

BamIndex* BamIndexFactory::CreateIndexFromFilename(const std::string& indexFilename,
                                                   BamReaderPrivate* reader)
{

    // get file extension from index filename, including dot (".EXT")
    // if can't get file extension, return null index
    const std::string extension = FileExtension(indexFilename);
    if (extension.empty()) return 0;

    // create index based on extension
    if (extension == BamStandardIndex::Extension())
        return new BamStandardIndex(reader);
    else if (extension == BamToolsIndex::Extension())
        return new BamToolsIndex(reader);
    else
        return 0;
}